

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_uhadd16_arm(uint32_t a,uint32_t b)

{
  return ((b >> 0x10) + (a >> 0x10) & 0xfffffffe) << 0xf | (b & 0xffff) + (a & 0xffff) >> 1;
}

Assistant:

uint32_t HELPER(glue(PFX,add16))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD16(a, b, 0);
    ADD16(a >> 16, b >> 16, 1);
    SET_GE;
    return res;
}